

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *pcVar2;
  container_type *pcVar3;
  allocator<char> local_99;
  string local_98;
  string *local_78;
  allocator<char> local_69;
  string local_68;
  string *local_48;
  undefined1 local_30 [8];
  cmList linkCmds;
  cmNinjaNormalTargetGenerator *this_local;
  
  linkCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cmList::cmList((cmList *)local_30);
  this_00 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar1 = cmGeneratorTarget::GetType(this_00);
  if (TVar1 == EXECUTABLE) {
    pcVar2 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",&local_99);
    local_78 = (string *)cmMakefile::GetDefinition(pcVar2,&local_98);
    cmList::assign((cmList *)local_30,(cmValue)local_78,Yes,No);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else if (TVar1 - STATIC_LIBRARY < 3) {
    pcVar2 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",&local_69);
    local_48 = (string *)cmMakefile::GetDefinition(pcVar2,&local_68);
    cmList::assign((cmList *)local_30,(cmValue)local_48,Yes,No);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  pcVar3 = cmList::data_abi_cxx11_((cmList *)local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,pcVar3);
  cmList::~cmList((cmList *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd()
{
  cmList linkCmds;

  // this target requires separable cuda compilation
  // now build the correct command depending on if the target is
  // an executable or a dynamic library.
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      linkCmds.assign(
        this->GetMakefile()->GetDefinition("CMAKE_CUDA_DEVICE_LINK_LIBRARY"));
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkCmds.assign(this->GetMakefile()->GetDefinition(
        "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE"));
    } break;
    default:
      break;
  }
  return std::move(linkCmds.data());
}